

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeCalcTabBarLayout
               (ImGuiDockNode *node,ImRect *out_title_rect,ImRect *out_tab_bar_rect,
               ImVec2 *out_window_menu_button_pos,ImVec2 *out_close_button_pos)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  float fVar6;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 window_menu_button_pos;
  float button_sz;
  ImRect r;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 *out_close_button_pos_local;
  ImVec2 *out_window_menu_button_pos_local;
  ImRect *out_tab_bar_rect_local;
  ImRect *out_title_rect_local;
  ImGuiDockNode *node_local;
  
  pIVar5 = GImGui;
  fVar6 = (GImGui->Style).FramePadding.y;
  ImRect::ImRect((ImRect *)&window_menu_button_pos.y,(node->Pos).x,(node->Pos).y,
                 (node->Pos).x + (node->Size).x,fVar6 + fVar6 + (node->Pos).y + GImGui->FontSize);
  if (out_title_rect != (ImRect *)0x0) {
    IVar1.y = button_sz;
    IVar1.x = window_menu_button_pos.y;
    out_title_rect->Min = IVar1;
    IVar3.y = r.Min.y;
    IVar3.x = r.Min.x;
    out_title_rect->Max = IVar3;
  }
  fVar6 = (pIVar5->Style).WindowBorderSize + window_menu_button_pos.y;
  window_menu_button_pos.x = pIVar5->FontSize;
  local_5c.y = button_sz;
  local_5c.x = fVar6;
  window_menu_button_pos.y = (pIVar5->Style).FramePadding.x + fVar6;
  r.Min.x = (r.Min.x - (pIVar5->Style).WindowBorderSize) - (pIVar5->Style).FramePadding.x;
  if (((*(ushort *)&node->field_0xbc >> 0xb & 1) != 0) &&
     (r.Min.x = r.Min.x - window_menu_button_pos.x, out_close_button_pos != (ImVec2 *)0x0)) {
    ImVec2::ImVec2(&local_64,r.Min.x - (pIVar5->Style).FramePadding.x,button_sz);
    *out_close_button_pos = local_64;
  }
  if (((*(ushort *)&node->field_0xbc >> 0xc & 1) == 0) ||
     ((pIVar5->Style).WindowMenuButtonPosition != 0)) {
    if (((*(ushort *)&node->field_0xbc >> 0xc & 1) != 0) &&
       ((pIVar5->Style).WindowMenuButtonPosition == 1)) {
      r.Min.x = r.Min.x - (window_menu_button_pos.x + (pIVar5->Style).FramePadding.x);
      ImVec2::ImVec2(&local_6c,r.Min.x,button_sz);
      local_5c = local_6c;
    }
  }
  else {
    window_menu_button_pos.y =
         window_menu_button_pos.x + (pIVar5->Style).ItemInnerSpacing.x + window_menu_button_pos.y;
  }
  if (out_tab_bar_rect != (ImRect *)0x0) {
    IVar2.y = button_sz;
    IVar2.x = window_menu_button_pos.y;
    out_tab_bar_rect->Min = IVar2;
    IVar4.y = r.Min.y;
    IVar4.x = r.Min.x;
    out_tab_bar_rect->Max = IVar4;
  }
  if (out_window_menu_button_pos != (ImVec2 *)0x0) {
    *out_window_menu_button_pos = local_5c;
  }
  return;
}

Assistant:

static void ImGui::DockNodeCalcTabBarLayout(const ImGuiDockNode* node, ImRect* out_title_rect, ImRect* out_tab_bar_rect, ImVec2* out_window_menu_button_pos, ImVec2* out_close_button_pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    ImRect r = ImRect(node->Pos.x, node->Pos.y, node->Pos.x + node->Size.x, node->Pos.y + g.FontSize + g.Style.FramePadding.y * 2.0f);
    if (out_title_rect) { *out_title_rect = r; }

    r.Min.x += style.WindowBorderSize;
    r.Max.x -= style.WindowBorderSize;

    float button_sz = g.FontSize;

    ImVec2 window_menu_button_pos = r.Min;
    r.Min.x += style.FramePadding.x;
    r.Max.x -= style.FramePadding.x;
    if (node->HasCloseButton)
    {
        r.Max.x -= button_sz;
        if (out_close_button_pos) *out_close_button_pos = ImVec2(r.Max.x - style.FramePadding.x, r.Min.y);
    }
    if (node->HasWindowMenuButton && style.WindowMenuButtonPosition == ImGuiDir_Left)
    {
        r.Min.x += button_sz + style.ItemInnerSpacing.x;
    }
    else if (node->HasWindowMenuButton && style.WindowMenuButtonPosition == ImGuiDir_Right)
    {
        r.Max.x -= button_sz + style.FramePadding.x;
        window_menu_button_pos = ImVec2(r.Max.x, r.Min.y);
    }
    if (out_tab_bar_rect) { *out_tab_bar_rect = r; }
    if (out_window_menu_button_pos) { *out_window_menu_button_pos = window_menu_button_pos; }
}